

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlers.c
# Opt level: O2

int chirc_handle(chirc_ctx_t *ctx,chirc_connection_t *conn,chirc_message_t *msg)

{
  char **ppcVar1;
  handler_entry *phVar2;
  int iVar3;
  handler_entry *phVar4;
  ulong uVar5;
  
  serverlog(DEBUG,conn,"Handling command %s",msg->cmd);
  uVar5 = 0;
  while (uVar5 < msg->nparams) {
    ppcVar1 = msg->params + uVar5;
    uVar5 = uVar5 + 1;
    serverlog(DEBUG,conn,"%s[%i] = %s",msg->cmd,uVar5 & 0xffffffff,*ppcVar1);
  }
  phVar2 = handlers;
  do {
    phVar4 = phVar2;
    if (phVar4->name == (char *)0x0) {
      return 0;
    }
    iVar3 = strcmp(msg->cmd,phVar4->name);
    phVar2 = phVar4 + 1;
  } while (iVar3 != 0);
  iVar3 = (*phVar4->func)(ctx,conn,msg);
  return iVar3;
}

Assistant:

int chirc_handle(chirc_ctx_t *ctx, chirc_connection_t *conn, chirc_message_t *msg)
{
    chirc_message_t reply;
    int rc=0, h;

    /* Print message to the server log */
    serverlog(DEBUG, conn, "Handling command %s", msg->cmd);
    for(int i=0; i<msg->nparams; i++)
        serverlog(DEBUG, conn, "%s[%i] = %s", msg->cmd, i + 1, msg->params[i]);

    /* Search the dispatch table for an entry corresponding to the
     * message we are processing */
    for(h=0; handlers[h].name != NULL; h++)
        if (!strcmp(msg->cmd, handlers[h].name))
        {

            rc = handlers[h].func(ctx, conn, msg);
            break;
        }


    return rc;
}